

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta,double obj_amp)

{
  undefined1 auVar1 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  undefined8 extraout_RAX;
  row_iterator prVar7;
  undefined8 uVar8;
  rc_data *prVar9;
  long lVar10;
  long lVar11;
  rc_data *__first;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_a0;
  int local_9c;
  rc_size local_98;
  bit_array *local_90;
  undefined1 local_88 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_70;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_68;
  double local_60;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_58;
  undefined8 local_50;
  double local_48;
  double local_40;
  double local_38;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_90 = x;
  local_60 = obj_amp;
  local_48 = theta;
  local_40 = delta;
  local_38 = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&local_38,&local_40,&local_48);
  _Var6._M_current = (first->current)._M_current;
  if (_Var6._M_current == (last->current)._M_current) {
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
  }
  else {
    local_58._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )((long)this + 0x10);
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
    local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)(tuple<int_*,_std::default_delete<int[]>_>)first
    ;
    local_70 = last;
    do {
      local_a0 = _Var6._M_current[-1];
      if (*(int *)(this + 0x88) <= local_a0) {
        push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_50 = uVar8;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_88,
                 (int)local_58._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar11 = *(long *)(this + 0x50);
        prVar7 = (row_iterator)local_88._8_8_;
        do {
          piVar3 = &prVar7->value;
          prVar7 = prVar7 + 1;
          *(double *)(lVar11 + (long)*piVar3 * 8) =
               local_48 * *(double *)(lVar11 + (long)*piVar3 * 8);
        } while (prVar7 != (row_iterator)local_88._0_8_);
      }
      local_98 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                             *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,
                            local_90);
      uVar5 = local_98.r_size;
      if (uVar5 != 0) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_60;
        __first = *(rc_data **)(this + 0x68);
        lVar10 = 0;
        lVar11 = *(long *)(*(long *)(this + 0x80) + 8);
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               *(ulong *)(lVar11 + (long)((row_iterator)
                                         (local_88._8_8_ +
                                         (long)*(int *)((long)&__first->id + lVar10) * 8))->column *
                                   8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)&__first->value + lVar10);
          auVar1 = vfmadd213sd_fma(auVar12,auVar13,auVar1);
          *(long *)((long)&__first->value + lVar10) = auVar1._0_8_;
          lVar10 = lVar10 + 0x10;
        } while (((ulong)local_98 & 0xffffffff) << 4 != lVar10);
        if (1 < (int)uVar5) {
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          prVar9 = __first + (int)uVar5;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9,(int)LZCOUNT((ulong)(uVar5 & 0x7fffffff)) * 2 ^ 0x7e);
          local_68._M_head_impl = (row_value *)prVar9;
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9);
          lVar11 = (long)(int)uVar5 * 0x10 + -0x10;
          prVar9 = __first;
          do {
            prVar9 = prVar9 + 1;
            if ((__first->value != prVar9->value) || (NAN(__first->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,prVar9,__g);
              __first = prVar9;
            }
            lVar11 = lVar11 + -0x10;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,(rc_data *)local_68._M_head_impl,__g);
          first = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   *)local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl;
          last = local_70;
        }
      }
      local_9c = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                     *)this,&local_98,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_a0 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_a0 * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_a0,
                 (int *)((long)local_a0 * 0xc + *(long *)(this + 0x70)));
      if (0 < local_98.r_size) {
        lVar11 = 0xc;
        lVar10 = 0;
        do {
          lVar2 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,double,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar2 + -4 + lVar11),
                     (double *)(lVar2 + -0xc + lVar11),(int *)(lVar2 + lVar11));
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar10 < local_98.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_a0 * 0xc),&local_9c);
      bVar4 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,local_90,(row_value *)local_88._8_8_,local_a0,local_9c,
                         local_98.r_size,local_38,local_40);
      uVar8._1_7_ = SUB87(local_50,1);
      uVar8._0_1_ = (byte)local_50 | bVar4;
      _Var6._M_current = *(int **)first + -1;
      *first = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                )_Var6._M_current;
    } while (_Var6._M_current != (last->current)._M_current);
  }
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }